

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_vli_modAdd(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                    wordcount_t num_words)

{
  ulong *puVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = (ulong)(byte)num_words;
  uVar4 = uVar2;
  if ('\0' < num_words) {
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar6 = left[uVar7];
      uVar9 = uVar6 + uVar5 + right[uVar7];
      uVar8 = (ulong)(uVar9 < uVar6);
      if (uVar9 == uVar6) {
        uVar8 = uVar5;
      }
      result[uVar7] = uVar9;
      uVar7 = uVar7 + 1;
      uVar5 = uVar8;
    } while (uVar2 != uVar7);
    if (uVar8 != 0) {
      if (num_words < '\x01') {
        return;
      }
      goto LAB_0010a790;
    }
  }
  do {
    uVar4 = uVar4 - 1;
    if ((char)uVar4 < '\0') break;
    uVar7 = (ulong)(((uint)uVar4 & 0x7f) << 3);
    uVar5 = *(ulong *)((long)mod + uVar7);
    uVar7 = *(ulong *)((long)result + uVar7);
    if (uVar7 < uVar5) {
      bVar3 = true;
      goto LAB_0010a784;
    }
  } while (uVar7 <= uVar5);
  bVar3 = false;
LAB_0010a784:
  if (num_words < '\x01' || bVar3) {
    return;
  }
LAB_0010a790:
  uVar5 = 0;
  uVar4 = 0;
  do {
    uVar6 = mod[uVar5] + uVar4;
    puVar1 = result + uVar5;
    uVar7 = *puVar1;
    *puVar1 = *puVar1 - uVar6;
    if (uVar6 != 0) {
      uVar4 = (ulong)(uVar7 < uVar6);
    }
    uVar5 = uVar5 + 1;
  } while (uVar2 != uVar5);
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modAdd(uECC_word_t *result,
                                  const uECC_word_t *left,
                                  const uECC_word_t *right,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t carry = uECC_vli_add(result, left, right, num_words);
    if (carry || uECC_vli_cmp_unsafe(mod, result, num_words) != 1) {
        /* result > mod (result = mod + remainder), so subtract mod to get remainder. */
        uECC_vli_sub(result, result, mod, num_words);
    }
}